

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void __thiscall
duckdb::BitpackingCompressionState<int,_true,_int>::CreateEmptySegment
          (BitpackingCompressionState<int,_true,_int> *this,idx_t row_start)

{
  optional_ptr<duckdb::FileBuffer,_true> *this_00;
  BlockManager *pBVar1;
  CompressionFunction *function;
  data_ptr_t pdVar2;
  undefined8 uVar3;
  DatabaseInstance *db;
  LogicalType *type;
  idx_t iVar4;
  idx_t iVar5;
  BufferManager *pBVar6;
  pointer pCVar7;
  undefined1 local_58 [40];
  
  local_58._8_8_ = row_start;
  db = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  type = ColumnDataCheckpointData::GetType(this->checkpoint_data);
  pBVar1 = (this->super_CompressionState).info.block_manager;
  function = this->function;
  iVar4 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar1->block_header_size);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)local_58,db,function,type,local_58._8_8_,iVar4 - iVar5,
             (this->super_CompressionState).info.block_manager);
  uVar3 = local_58._0_8_;
  local_58._0_8_ = (ColumnSegment *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &this->current_segment,(pointer)uVar3);
  pBVar6 = BufferManager::GetBufferManager(db);
  pCVar7 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  (*pBVar6->_vptr_BufferManager[7])(local_58 + 0x10,pBVar6,&pCVar7->block);
  BufferHandle::operator=(&this->handle,(BufferHandle *)(local_58 + 0x10));
  BufferHandle::~BufferHandle((BufferHandle *)(local_58 + 0x10));
  this_00 = &(this->handle).node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_00);
  this->data_ptr = ((this->handle).node.ptr)->buffer + 8;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_00);
  pBVar1 = (this->super_CompressionState).info.block_manager;
  pdVar2 = ((this->handle).node.ptr)->buffer;
  iVar4 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar1->block_header_size);
  uVar3 = local_58._0_8_;
  this->metadata_ptr = pdVar2 + (iVar4 - iVar5);
  if ((ColumnSegment *)local_58._0_8_ != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment((ColumnSegment *)local_58._0_8_);
    operator_delete((void *)uVar3);
  }
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();

		auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start,
		                                                                info.GetBlockSize(), info.GetBlockManager());
		current_segment = std::move(compressed_segment);

		auto &buffer_manager = BufferManager::GetBufferManager(db);
		handle = buffer_manager.Pin(current_segment->block);

		data_ptr = handle.Ptr() + BitpackingPrimitives::BITPACKING_HEADER_SIZE;
		metadata_ptr = handle.Ptr() + info.GetBlockSize();
	}